

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

Var Js::GlobalObject::EntryEmitTTDLog(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptString *uriString;
  long lVar7;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x675,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pJVar2 = (((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary;
  lVar7 = 0x3f0;
  if ((local_38._0_4_ & 0xffffff) == 2) {
    pvVar6 = Arguments::operator[]((Arguments *)local_38,1);
    bVar4 = VarIs<Js::JavascriptString>(pvVar6);
    if (bVar4) {
      pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1->TTDShouldPerformReplayAction == true) {
        TTD::EventLog::ReplayEmitLogEvent(pSVar1->threadContext->TTDLog);
      }
      else {
        if (pSVar1->TTDShouldPerformRecordAction != true) goto LAB_00a27458;
        pvVar6 = Arguments::operator[]((Arguments *)local_38,1);
        uriString = VarTo<Js::JavascriptString>(pvVar6);
        TTD::EventLog::RecordEmitLogEvent
                  (((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
                    .scriptContext.ptr)->threadContext->TTDLog,uriString);
      }
      lVar7 = 1000;
    }
  }
LAB_00a27458:
  return *(Var *)((long)&(pJVar2->super_JavascriptLibraryBase).super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar7);
}

Assistant:

Var GlobalObject::EntryEmitTTDLog(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        Js::JavascriptLibrary* jslib = function->GetScriptContext()->GetLibrary();

        if(args.Info.Count != 2 || !Js::VarIs<Js::JavascriptString>(args[1]))
        {
            return jslib->GetFalse();
        }

        if(function->GetScriptContext()->ShouldPerformReplayAction())
        {
            function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayEmitLogEvent();

            return jslib->GetTrue();
        }

        if(function->GetScriptContext()->ShouldPerformRecordAction())
        {
            Js::JavascriptString* jsString = Js::VarTo<Js::JavascriptString>(args[1]);
            function->GetScriptContext()->GetThreadContext()->TTDLog->RecordEmitLogEvent(jsString);

            return jslib->GetTrue();
        }

        return jslib->GetFalse();
    }